

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLTexureUpload2D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *local_68;
  void *to_upload;
  int is_subimage;
  int expand;
  int maxheight;
  int maxwidth;
  GLenum binding_local;
  AGLTextureData *data_local;
  AGLTexture *tex_local;
  GLenum GStack_10;
  A__GLTextureFormat tf_local;
  
  iVar3 = data->x + data->width;
  iVar4 = data->y + data->height;
  bVar1 = true;
  if (iVar3 <= tex->width) {
    bVar1 = tex->height < iVar4;
  }
  bVar2 = true;
  if (data->x < 1) {
    bVar2 = 0 < data->y;
  }
  if ((bVar2) || (data->pixels == (void *)0x0)) {
    local_68 = (void *)0x0;
  }
  else {
    local_68 = data->pixels;
  }
  if (binding != 0xde1) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3fc,"binding == GL_TEXTURE_2D");
    aAppTerminate(-1);
  }
  GStack_10 = tf.format;
  if ((bVar1) || (local_68 != (void *)0x0)) {
    glTexImage2D(binding,0,tf._0_8_ & 0xffffffff,iVar3,iVar4,0,GStack_10,tf.type,local_68);
    tex->width = iVar3;
    tex->height = iVar4;
  }
  if (bVar2) {
    if (data->pixels == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x406,"data->pixels");
      aAppTerminate(-1);
    }
    glTexSubImage2D(binding,0,data->x,data->y,data->width,data->height,GStack_10,tf.type,
                    data->pixels);
  }
  return;
}

Assistant:

static void a__GLTexureUpload2D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;
	const int maxheight = data->y + data->height;

	const int expand = (maxwidth > tex->width) || (maxheight > tex->height);
	const int is_subimage = (data->x > 0 || data->y > 0);
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_2D);

	if (expand || to_upload) {
		AGL__CALL(glTexImage2D(binding, 0, tf.internal, maxwidth, maxheight, 0,
			tf.format, tf.type, to_upload));
		tex->width = maxwidth;
		tex->height = maxheight;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage2D(binding, 0,
			data->x, data->y, data->width, data->height,
			tf.format, tf.type, data->pixels));
	}
}